

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyImplPrivate::appendDownstreamData(QNetworkReplyImplPrivate *this,QByteDataBuffer *data)

{
  char cVar1;
  QByteArray *pQVar2;
  char *pcVar3;
  long lVar4;
  ulong i;
  
  cVar1 = QIODevice::isOpen();
  if (cVar1 == '\0') {
    return;
  }
  if ((this->cacheEnabled == true) && (this->cacheSaveDevice == (QIODevice *)0x0)) {
    initCacheSaveDevice(this);
  }
  if ((data->buffers).d.size == 0) {
    lVar4 = 0;
  }
  else {
    i = 0;
    lVar4 = 0;
    do {
      pQVar2 = QByteDataBuffer::operator[](data,i);
      if (this->cacheSaveDevice != (QIODevice *)0x0) {
        pcVar3 = (pQVar2->d).ptr;
        if (pcVar3 == (char *)0x0) {
          pcVar3 = (char *)&QByteArray::_empty;
        }
        QIODevice::write((char *)this->cacheSaveDevice,(longlong)pcVar3);
      }
      QRingBuffer::append(*(QByteArray **)&(this->super_QNetworkReplyPrivate).field_0x90);
      lVar4 = lVar4 + (pQVar2->d).size;
      i = i + 1;
    } while (i < (ulong)(data->buffers).d.size);
  }
  QList<QByteArray>::clear(&data->buffers);
  data->bufferCompleteSize = 0;
  data->firstPos = 0;
  this->bytesDownloaded = this->bytesDownloaded + lVar4;
  appendDownstreamDataSignalEmissions(this);
  return;
}

Assistant:

void QNetworkReplyImplPrivate::appendDownstreamData(QByteDataBuffer &data)
{
    Q_Q(QNetworkReplyImpl);
    if (!q->isOpen())
        return;

    if (cacheEnabled && !cacheSaveDevice) {
        initCacheSaveDevice();
    }

    qint64 bytesWritten = 0;
    for (qsizetype i = 0; i < data.bufferCount(); ++i) {
        QByteArray const &item = data[i];

        if (cacheSaveDevice)
            cacheSaveDevice->write(item.constData(), item.size());
        buffer.append(item);

        bytesWritten += item.size();
    }
    data.clear();

    bytesDownloaded += bytesWritten;

    appendDownstreamDataSignalEmissions();
}